

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus
calculateRowValuesQuad
          (HighsLp *lp,vector<double,_std::allocator<double>_> *col_value,
          vector<double,_std::allocator<double>_> *row_value,HighsInt report_row)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  HighsStatus HVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> row_value_quad;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_68;
  value_type local_48;
  
  pdVar2 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = lp->num_col_;
  bVar4 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  HVar5 = kError;
  if ((bVar4) && (iVar7 == (int)((ulong)((long)pdVar2 - (long)pdVar3) >> 3))) {
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.hi = 0.0;
    local_48.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&local_68,(long)lp->num_row_,&local_48);
    iVar7 = lp->num_col_;
    if (0 < iVar7) {
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        lVar10 = (long)piVar6[uVar8];
        uVar9 = uVar8 + 1;
        if (piVar6[uVar8] < piVar6[uVar8 + 1]) {
          do {
            iVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10];
            pdVar2 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar13 = pdVar2[uVar8] *
                     (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar10];
            dVar12 = local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar7].hi;
            dVar11 = dVar13 + dVar12;
            local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7].hi = dVar11;
            dVar12 = (dVar12 - (dVar11 - dVar13)) + (dVar13 - (dVar11 - (dVar11 - dVar13))) +
                     local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar7].lo;
            local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7].lo = dVar12;
            if (iVar7 == report_row) {
              printf("calculateRowValuesQuad: Row %d becomes %g due to contribution of .col_value[%d] = %g\n"
                     ,dVar11 + dVar12,pdVar2[uVar8],(ulong)(uint)report_row,uVar8 & 0xffffffff);
              piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < piVar6[uVar9]);
          iVar7 = lp->num_col_;
        }
        uVar8 = uVar9;
      } while ((long)uVar9 < (long)iVar7);
    }
    std::vector<double,_std::allocator<double>_>::resize(row_value,(long)lp->num_row_);
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar2 = (row_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        pdVar1 = (double *)
                 ((long)&(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                          _M_impl.super__Vector_impl_data._M_start)->hi + lVar10 * 2);
        *(double *)((long)pdVar2 + lVar10) = *pdVar1 + pdVar1[1];
        lVar10 = lVar10 + 8;
      } while ((pointer)(pdVar1 + 2) !=
               local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    HVar5 = kOk;
  }
  return HVar5;
}

Assistant:

HighsStatus calculateRowValuesQuad(const HighsLp& lp,
                                   const std::vector<double>& col_value,
                                   std::vector<double>& row_value,
                                   const HighsInt report_row) {
  const bool correct_size = int(col_value.size()) == lp.num_col_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> row_value_quad;
  row_value_quad.assign(lp.num_row_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      row_value_quad[row] += col_value[col] * lp.a_matrix_.value_[i];
      if (row == report_row) {
        printf(
            "calculateRowValuesQuad: Row %d becomes %g due to contribution of "
            ".col_value[%d] = %g\n",
            int(row), double(row_value_quad[row]), int(col), col_value[col]);
      }
    }
  }

  // assign quad values to double vector
  row_value.resize(lp.num_row_);
  std::transform(row_value_quad.begin(), row_value_quad.end(),
                 row_value.begin(), [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}